

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

TCGOp * tcg_op_alloc(TCGContext_conflict9 *s,TCGOpcode opc)

{
  TCGOp *pTVar1;
  
  pTVar1 = (s->free_ops).tqh_first;
  if (pTVar1 == (TCGOp *)0x0) {
    pTVar1 = (TCGOp *)s->pool_cur;
    if ((TCGOp *)s->pool_end < pTVar1 + 1) {
      pTVar1 = (TCGOp *)tcg_malloc_internal_tricore(s,0x78);
    }
    else {
      s->pool_cur = (uint8_t *)(pTVar1 + 1);
    }
  }
  else {
    tcg_op_alloc_cold_1();
  }
  *(undefined8 *)pTVar1 = 0;
  *(TCGOpcode *)pTVar1 = opc & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
  s->nb_ops = s->nb_ops + 1;
  return pTVar1;
}

Assistant:

static TCGOp *tcg_op_alloc(TCGContext *s, TCGOpcode opc)
{
    TCGOp *op;

    if (likely(QTAILQ_EMPTY(&s->free_ops))) {
        op = tcg_malloc(s, sizeof(TCGOp));
    } else {
        op = QTAILQ_FIRST(&s->free_ops);
        QTAILQ_REMOVE(&s->free_ops, op, link);
    }
    memset(op, 0, offsetof(TCGOp, link));
    op->opc = opc;
    s->nb_ops++;

    return op;
}